

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storedenum.hpp
# Opt level: O0

flag_type __thiscall
stored_flags<setup::(anonymous_namespace)::stored_ini_flags,_16UL>::get
          (stored_flags<setup::(anonymous_namespace)::stored_ini_flags,_16UL> *this)

{
  logger *this_00;
  size_t i;
  uint64_t set_bits;
  flag_type result;
  undefined4 in_stack_fffffffffffffe18;
  log_level in_stack_fffffffffffffe1c;
  logger *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  flags<setup::component_entry::flags_Enum_,_5UL> *in_stack_fffffffffffffe30;
  stored_bitfield<5UL,_32UL> *in_stack_fffffffffffffe40;
  logger *in_stack_ffffffffffffff50;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_8;
  
  local_18 = stored_bitfield<5UL,_32UL>::lower_bits(in_stack_fffffffffffffe40);
  flags<setup::info::entry_types_Enum_,_21UL>::flags
            ((flags<setup::info::entry_types_Enum_,_21UL> *)in_stack_fffffffffffffe20,
             (Zero)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  for (local_20 = 0; local_20 < 5; local_20 = local_20 + 1) {
    if ((local_18 & 1L << ((byte)local_20 & 0x3f)) != 0) {
      flags<setup::component_entry::flags_Enum_,_5UL>::operator|=
                (in_stack_fffffffffffffe30,(enum_type)((ulong)in_stack_fffffffffffffe28 >> 0x20));
      local_18 = (1L << ((byte)local_20 & 0x3f) ^ 0xffffffffffffffffU) & local_18;
    }
  }
  if (local_18 != 0) {
    logger::logger(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c);
    logger::operator<<(in_stack_fffffffffffffe20,
                       (char (*) [10])CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
    ;
    logger::operator<<(in_stack_fffffffffffffe20,
                       (char **)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    logger::operator<<(in_stack_fffffffffffffe20,
                       (char (*) [10])CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18))
    ;
    logger::operator<<(in_stack_fffffffffffffe20,
                       (_func_ios_base_ptr_ios_base_ptr *)
                       CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    this_00 = logger::operator<<(in_stack_fffffffffffffe20,
                                 (unsigned_long *)
                                 CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    logger::operator<<(this_00,(_func_ios_base_ptr_ios_base_ptr *)
                               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    logger::~logger(in_stack_ffffffffffffff50);
  }
  return (flag_type)local_8;
}

Assistant:

flag_type get() {
		
		boost::uint64_t set_bits = this->lower_bits();
		flag_type result = 0;
		
		for(size_t i = 0; i < this->size; i++) {
			if(set_bits & (boost::uint64_t(1) << i)) {
				result |= Mapping::values[i];
				set_bits &= ~(boost::uint64_t(1) << i);
			}
		}
		
		if(set_bits) {
			log_warning << "Unexpected " << enum_names<enum_type>::name << " flags: "
			            << std::hex << set_bits << std::dec;
		}
		
		return result;
	}